

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat * __thiscall Mat::operator+(Mat *__return_storage_ptr__,Mat *this,ll128 *b)

{
  ulong *puVar1;
  pointer p_Var2;
  pointer p_Var3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar5 = this->c * this->r;
  if (0 < (int)uVar5) {
    p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      puVar1 = (ulong *)((long)p_Var2 + lVar7);
      uVar8 = (ulong)*b + *puVar1;
      lVar9 = *(long *)((long)b + 8) + *(long *)((long)p_Var2 + lVar7 + 8) +
              (ulong)CARRY8((ulong)*b,*puVar1);
      uVar6 = uVar8 + 0x16345785d8a0003;
      lVar4 = lVar9 + (ulong)(0xfe9cba87a275fffc < uVar8);
      if ((SBORROW8(lVar9,-1) != SBORROW8(lVar9 + 1,(ulong)(uVar8 < 0xfe9cba87a275fffe))) ==
          (long)((lVar9 + 1) - (ulong)(uVar8 < 0xfe9cba87a275fffe)) < 0) {
        uVar6 = uVar8;
        lVar4 = lVar9;
      }
      if (-lVar9 < (long)(ulong)(0x16345785d8a0002 < uVar8)) {
        uVar6 = uVar8 + 0xfe9cba87a275fffd;
        lVar4 = lVar9 + -1 + (ulong)(0x16345785d8a0002 < uVar8);
      }
      *(ulong *)((long)p_Var3 + lVar7) = uVar6;
      *(long *)((long)p_Var3 + lVar7 + 8) = lVar4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator+(const ll128 &b) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + b;
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}